

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestPackage.cpp
# Opt level: O0

void __thiscall vkt::TestCaseExecutor::deinit(TestCaseExecutor *this,TestCase *param_1)

{
  TestLog *log_00;
  bool bVar1;
  DebugReportRecorder *pDVar2;
  TestContext *pTVar3;
  DebugReportMessage *pDVar4;
  MessageBuilder *this_00;
  char *description;
  string local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  MessageBuilder local_270;
  const_iterator local_f0;
  undefined1 local_d8 [8];
  const_iterator curMsg;
  int numErrors;
  allocator<char> local_81;
  string local_80;
  ScopedLogSection local_60;
  ScopedLogSection section;
  const_iterator local_40;
  TestLog *local_28;
  TestLog *log;
  DebugMessages *messages;
  TestCase *param_3_local;
  TestCaseExecutor *this_local;
  
  messages = (DebugMessages *)param_1;
  param_3_local = (TestCase *)this;
  if (this->m_instance != (TestInstance *)0x0) {
    (*this->m_instance->_vptr_TestInstance[1])();
  }
  this->m_instance = (TestInstance *)0x0;
  bVar1 = de::details::UniqueBase::operator_cast_to_bool((UniqueBase *)&this->m_debugReportRecorder)
  ;
  if (bVar1) {
    pDVar2 = de::details::
             UniqueBase<vk::DebugReportRecorder,_de::DefaultDeleter<vk::DebugReportRecorder>_>::
             operator->(&(this->m_debugReportRecorder).
                         super_UniqueBase<vk::DebugReportRecorder,_de::DefaultDeleter<vk::DebugReportRecorder>_>
                       );
    log = (TestLog *)::vk::DebugReportRecorder::getMessages(pDVar2);
    pTVar3 = Context::getTestContext(&this->m_context);
    local_28 = tcu::TestContext::getLog(pTVar3);
    de::AppendList<vk::DebugReportMessage>::begin
              (&local_40,(AppendList<vk::DebugReportMessage> *)log);
    de::AppendList<vk::DebugReportMessage>::end
              ((const_iterator *)&section,(AppendList<vk::DebugReportMessage> *)log);
    bVar1 = de::AppendList<vk::DebugReportMessage>::Iterator<const_vk::DebugReportMessage>::
            operator!=(&local_40,(Iterator<const_vk::DebugReportMessage> *)&section);
    log_00 = local_28;
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_80,"DebugMessages",&local_81);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&numErrors,"Debug Messages",
                 (allocator<char> *)((long)&curMsg.m_slotNdx + 7));
      tcu::ScopedLogSection::ScopedLogSection(&local_60,log_00,&local_80,(string *)&numErrors);
      std::__cxx11::string::~string((string *)&numErrors);
      std::allocator<char>::~allocator((allocator<char> *)((long)&curMsg.m_slotNdx + 7));
      std::__cxx11::string::~string((string *)&local_80);
      std::allocator<char>::~allocator(&local_81);
      curMsg.m_slotNdx._0_4_ = 0;
      de::AppendList<vk::DebugReportMessage>::begin
                ((const_iterator *)local_d8,(AppendList<vk::DebugReportMessage> *)log);
      while( true ) {
        de::AppendList<vk::DebugReportMessage>::end
                  (&local_f0,(AppendList<vk::DebugReportMessage> *)log);
        bVar1 = de::AppendList<vk::DebugReportMessage>::Iterator<const_vk::DebugReportMessage>::
                operator!=((Iterator<const_vk::DebugReportMessage> *)local_d8,&local_f0);
        if (!bVar1) break;
        pDVar4 = de::AppendList<vk::DebugReportMessage>::Iterator<const_vk::DebugReportMessage>::
                 operator->((Iterator<const_vk::DebugReportMessage> *)local_d8);
        if ((pDVar4->flags & 0xe) != 0) {
          tcu::TestLog::operator<<(&local_270,local_28,(BeginMessageToken *)&tcu::TestLog::Message);
          pDVar4 = de::AppendList<vk::DebugReportMessage>::Iterator<const_vk::DebugReportMessage>::
                   operator*((Iterator<const_vk::DebugReportMessage> *)local_d8);
          this_00 = tcu::MessageBuilder::operator<<(&local_270,pDVar4);
          tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_270);
        }
        pDVar4 = de::AppendList<vk::DebugReportMessage>::Iterator<const_vk::DebugReportMessage>::
                 operator->((Iterator<const_vk::DebugReportMessage> *)local_d8);
        if ((pDVar4->flags & 8) != 0) {
          curMsg.m_slotNdx._0_4_ = (int)curMsg.m_slotNdx + 1;
        }
        de::AppendList<vk::DebugReportMessage>::Iterator<const_vk::DebugReportMessage>::operator++
                  ((Iterator<const_vk::DebugReportMessage> *)local_d8);
      }
      pDVar2 = de::details::
               UniqueBase<vk::DebugReportRecorder,_de::DefaultDeleter<vk::DebugReportRecorder>_>::
               operator->(&(this->m_debugReportRecorder).
                           super_UniqueBase<vk::DebugReportRecorder,_de::DefaultDeleter<vk::DebugReportRecorder>_>
                         );
      ::vk::DebugReportRecorder::clearMessages(pDVar2);
      if (0 < (int)curMsg.m_slotNdx) {
        pTVar3 = Context::getTestContext(&this->m_context);
        de::toString<int>(&local_2b0,(int *)&curMsg.m_slotNdx);
        std::operator+(&local_290,&local_2b0," API usage errors found");
        description = (char *)std::__cxx11::string::c_str();
        tcu::TestContext::setTestResult(pTVar3,QP_TEST_RESULT_INTERNAL_ERROR,description);
        std::__cxx11::string::~string((string *)&local_290);
        std::__cxx11::string::~string((string *)&local_2b0);
      }
      tcu::ScopedLogSection::~ScopedLogSection(&local_60);
    }
  }
  return;
}

Assistant:

void TestCaseExecutor::deinit (tcu::TestCase*)
{
	delete m_instance;
	m_instance = DE_NULL;

	// Collect and report any debug messages
	if (m_debugReportRecorder)
	{
		// \note We are not logging INFORMATION and DEBUG messages
		static const vk::VkDebugReportFlagsEXT			errorFlags		= vk::VK_DEBUG_REPORT_ERROR_BIT_EXT;
		static const vk::VkDebugReportFlagsEXT			logFlags		= errorFlags
																		| vk::VK_DEBUG_REPORT_WARNING_BIT_EXT
																		| vk::VK_DEBUG_REPORT_PERFORMANCE_WARNING_BIT_EXT;

		typedef vk::DebugReportRecorder::MessageList	DebugMessages;

		const DebugMessages&	messages	= m_debugReportRecorder->getMessages();
		tcu::TestLog&			log			= m_context.getTestContext().getLog();

		if (messages.begin() != messages.end())
		{
			const tcu::ScopedLogSection	section		(log, "DebugMessages", "Debug Messages");
			int							numErrors	= 0;

			for (DebugMessages::const_iterator curMsg = messages.begin(); curMsg != messages.end(); ++curMsg)
			{
				if ((curMsg->flags & logFlags) != 0)
					log << tcu::TestLog::Message << *curMsg << tcu::TestLog::EndMessage;

				if ((curMsg->flags & errorFlags) != 0)
					numErrors += 1;
			}

			m_debugReportRecorder->clearMessages();

			if (numErrors > 0)
				m_context.getTestContext().setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, (de::toString(numErrors) + " API usage errors found").c_str());
		}
	}
}